

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CIdExp *exp)

{
  allocator local_89;
  string local_88 [48];
  string local_58 [32];
  undefined1 local_38 [40];
  CIdExp *exp_local;
  CPrintVisitor *this_local;
  
  this->lastVisited = this->lastVisited + 1;
  local_38._32_8_ = exp;
  exp_local = (CIdExp *)this;
  std::operator<<((ostream *)&std::cout,(string *)&exp->name);
  std::__cxx11::string::string(local_58,(string *)(local_38._32_8_ + 0x18));
  ConstructLabel((CPrintVisitor *)local_38,(string *)this,(int)local_58);
  std::__cxx11::string::operator=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  AddArrow(this,this->lastVisited);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"IdExp",&local_89);
  AddLabel(this,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void CPrintVisitor::Visit(CIdExp &exp) {
	++lastVisited;
	std::cout << exp.name;
	this->description = ConstructLabel(exp.name, lastVisited);
	AddArrow(lastVisited);
	AddLabel("IdExp");
	++lastVisited;
}